

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.h
# Opt level: O3

int __thiscall io_buf::open_file(io_buf *this,char *name,bool stdin_off,int flag)

{
  size_t sVar1;
  int *piVar2;
  char *pcVar3;
  vw_exception *this_00;
  char *__buf;
  stringstream __msg;
  char __errmsg [256];
  int local_2d4;
  string local_2d0;
  stringstream local_2b0 [16];
  ostream local_2a0;
  char local_128 [264];
  
  if (flag == 2) {
    local_2d4 = open64(name,0x241,0x1b6);
  }
  else {
    if (flag != 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Unknown file operation. Something other than READ/WRITE specified",0x41);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
      std::ostream::put('8');
      std::ostream::flush();
      local_2d4 = -1;
      goto LAB_00133daf;
    }
    if (*name == '\0') {
      if (stdin_off) {
        return -1;
      }
      local_2d4 = fileno(_stdin);
    }
    else {
      local_2d4 = open64(name,0);
    }
  }
  if ((local_2d4 != -1) && (v_array<int>::push_back(&this->files,&local_2d4), local_2d4 != -1)) {
    return local_2d4;
  }
LAB_00133daf:
  if (*name == '\0') {
    return -1;
  }
  std::__cxx11::stringstream::stringstream(local_2b0);
  std::__ostream_insert<char,std::char_traits<char>>(&local_2a0,"can\'t open: ",0xc);
  sVar1 = strlen(name);
  std::__ostream_insert<char,std::char_traits<char>>(&local_2a0,name,sVar1);
  piVar2 = __errno_location();
  __buf = local_128;
  pcVar3 = strerror_r(*piVar2,__buf,0x100);
  if (pcVar3 == (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(&local_2a0,"errno = ",8);
    sVar1 = strlen(__buf);
  }
  else {
    sVar1 = 0xf;
    __buf = "errno = unknown";
  }
  std::__ostream_insert<char,std::char_traits<char>>(&local_2a0,__buf,sVar1);
  this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/io_buf.h"
             ,0x8f,&local_2d0);
  __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

virtual int open_file(const char* name, bool stdin_off, int flag = READ)
  {
    int ret = -1;
    switch (flag)
    {
      case READ:
        if (*name != '\0')
        {
#ifdef _WIN32
          // _O_SEQUENTIAL hints to OS that we'll be reading sequentially, so cache aggressively.
          _sopen_s(&ret, name, _O_RDONLY | _O_BINARY | _O_SEQUENTIAL, _SH_DENYWR, 0);
#else
          ret = open(name, O_RDONLY | O_LARGEFILE);
#endif
        }
        else if (!stdin_off)
#ifdef _WIN32
          ret = _fileno(stdin);
#else
          ret = fileno(stdin);
#endif
        if (ret != -1)
          files.push_back(ret);
        break;

      case WRITE:
#ifdef _WIN32
        _sopen_s(&ret, name, _O_CREAT | _O_WRONLY | _O_BINARY | _O_TRUNC, _SH_DENYWR, _S_IREAD | _S_IWRITE);
#else
        ret = open(name, O_CREAT | O_WRONLY | O_LARGEFILE | O_TRUNC, 0666);
#endif
        if (ret != -1)
          files.push_back(ret);
        break;

      default:
        std::cerr << "Unknown file operation. Something other than READ/WRITE specified" << std::endl;
        ret = -1;
    }
    if (ret == -1 && *name != '\0')
      THROWERRNO("can't open: " << name);
    return ret;
  }